

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall
xLearn::DMATRIX_TEST_Serialize_and_Deserialize_Test::TestBody
          (DMATRIX_TEST_Serialize_and_Deserialize_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  reference ppvVar4;
  undefined1 auVar5 [16];
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  iterator iter;
  SparseRow *row;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  size_t i_1;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t i;
  DMatrix matrix;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffb58;
  undefined7 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb67;
  float *in_stack_fffffffffffffb68;
  undefined7 in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb77;
  char *in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  undefined8 in_stack_fffffffffffffc50;
  index_t in_stack_fffffffffffffc58;
  index_t in_stack_fffffffffffffc5c;
  DMatrix *in_stack_fffffffffffffc60;
  allocator *filename;
  AssertHelper local_378;
  Message local_370;
  AssertionResult local_368;
  AssertHelper local_358;
  Message local_350;
  AssertionResult local_348;
  AssertHelper local_338;
  Message local_330;
  AssertionResult local_328;
  Node *local_318;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  local_310;
  value_type local_308;
  AssertHelper local_300;
  Message local_2f8;
  undefined8 local_2f0;
  string *in_stack_fffffffffffffd18;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd20;
  AssertHelper local_2d8;
  Message local_2d0;
  AssertionResult local_2c8;
  ulong local_2b8;
  AssertHelper local_2b0;
  Message local_2a8;
  undefined1 local_299;
  AssertionResult local_298;
  AssertHelper local_288;
  Message local_280;
  undefined4 local_274;
  AssertionResult local_270;
  AssertHelper local_260;
  Message local_258;
  undefined4 local_24c;
  AssertionResult local_248;
  AssertHelper local_238;
  Message local_230;
  AssertionResult local_228;
  allocator local_211;
  string local_210 [32];
  AssertHelper local_1f0;
  Message local_1e8;
  undefined1 local_1da;
  undefined1 local_1d9;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined1 local_1b2;
  undefined1 local_1b1;
  AssertionResult local_1b0;
  AssertHelper local_1a0;
  Message local_198;
  undefined1 local_18a;
  undefined1 local_189;
  AssertionResult local_188;
  AssertHelper local_178;
  Message local_170;
  undefined4 local_164;
  AssertionResult local_160;
  AssertHelper local_150;
  Message local_148;
  undefined4 local_13c;
  string *in_stack_fffffffffffffec8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  AssertHelper local_128;
  Message local_120;
  undefined4 local_114;
  AssertionResult local_110;
  AssertHelper local_100;
  Message local_f8;
  undefined4 local_ec;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff20;
  AssertHelper in_stack_ffffffffffffff28;
  Message local_d0;
  undefined1 local_c1;
  AssertionResult local_c0;
  allocator local_a9;
  string local_a8 [32];
  ulong local_88;
  DMatrix local_70;
  
  DMatrix::DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  DMatrix::Reset((DMatrix *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  for (local_88 = 0; local_88 < 10; local_88 = local_88 + 1) {
    DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
    auVar5 = SUB6416(ZEXT464(0x40200000),0);
    DMatrix::AddNode(in_stack_fffffffffffffc60,in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58,
                     (real_t)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                     (index_t)in_stack_fffffffffffffc50);
    auVar5 = vcvtusi2ss_avx512f(auVar5,local_88);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_70.Y,local_88);
    *pvVar2 = auVar5._0_4_;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_70.norm,local_88);
    *pvVar2 = 0.25;
  }
  DMatrix::SetHash(&local_70,0x4d2,0x162e);
  filename = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"/tmp/test.bin",filename);
  DMatrix::Serialize((DMatrix *)in_stack_fffffffffffffed0.ptr_,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  DMatrix::Reset((DMatrix *)CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0));
  local_c1 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (bool *)in_stack_fffffffffffffb68,
             (bool *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x151f67);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff28,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff28);
    testing::Message::~Message((Message *)0x151fca);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15201f);
  local_ec = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (unsigned_long *)in_stack_fffffffffffffb68,
             (int *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff18);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1520c6);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message((Message *)0x152129);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15217e);
  local_114 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (unsigned_long *)in_stack_fffffffffffffb68,
             (int *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152225);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message((Message *)0x152288);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1522dd);
  local_13c = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (uint *)in_stack_fffffffffffffb68,
             (int *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffec8);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152384);
    testing::internal::AssertHelper::AssertHelper
              (&local_150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=(&local_150,&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_150);
    testing::Message::~Message((Message *)0x1523e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15243c);
  local_164 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (uint *)in_stack_fffffffffffffb68,
             (int *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_160);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1524e3);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x66,pcVar3);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message((Message *)0x152546);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15259b);
  local_189 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  local_18a = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (bool *)in_stack_fffffffffffffb68,
             (bool *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_188);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152653);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x67,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message((Message *)0x1526b6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15270b);
  local_1b1 = std::vector<float,_std::allocator<float>_>::empty
                        ((vector<float,_std::allocator<float>_> *)
                         CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  local_1b2 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (bool *)in_stack_fffffffffffffb68,
             (bool *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1527c3);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x68,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&local_1c8);
    testing::Message::~Message((Message *)0x152826);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15287b);
  local_1d9 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::empty((vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                       *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70));
  local_1da = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (bool *)in_stack_fffffffffffffb68,
             (bool *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152933);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x152996);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1529ee);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"/tmp/test.bin",&local_211);
  DMatrix::Deserialize((DMatrix *)in_stack_fffffffffffffd20.ptr_,in_stack_fffffffffffffd18);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (uint *)in_stack_fffffffffffffb68,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152b36);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message((Message *)0x152b99);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x152bee);
  local_24c = 0x4d2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (unsigned_long *)in_stack_fffffffffffffb68,
             (int *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152c8f);
    testing::internal::AssertHelper::AssertHelper
              (&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=(&local_260,&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_260);
    testing::Message::~Message((Message *)0x152cec);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x152d41);
  local_274 = 0x162e;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (unsigned_long *)in_stack_fffffffffffffb68,
             (int *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152de2);
    testing::internal::AssertHelper::AssertHelper
              (&local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=(&local_288,&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_288);
    testing::Message::~Message((Message *)0x152e3f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x152e94);
  local_299 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffb78,
             (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
             (bool *)in_stack_fffffffffffffb68,
             (bool *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x152f32);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    testing::Message::~Message((Message *)0x152f8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x152fe7);
  for (local_2b8 = 0; local_2b8 < 10; local_2b8 = local_2b8 + 1) {
    std::vector<float,_std::allocator<float>_>::operator[](&local_70.Y,local_2b8);
    testing::internal::EqHelper<false>::Compare<float,unsigned_long>
              (in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
    if (!bVar1) {
      testing::Message::Message(&local_2d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1530a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0x75,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
      testing::internal::AssertHelper::~AssertHelper(&local_2d8);
      testing::Message::~Message((Message *)0x153105);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x15315a);
    std::vector<float,_std::allocator<float>_>::operator[](&local_70.norm,local_2b8);
    local_2f0 = 0x3fd0000000000000;
    testing::internal::EqHelper<false>::Compare<float,double>
              (in_stack_fffffffffffffb78,
               (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68,
               (double *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd18);
    if (!bVar1) {
      testing::Message::Message(&local_2f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x153212);
      testing::internal::AssertHelper::AssertHelper
                (&local_300,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0x76,pcVar3);
      testing::internal::AssertHelper::operator=(&local_300,&local_2f8);
      testing::internal::AssertHelper::~AssertHelper(&local_300);
      testing::Message::~Message((Message *)0x15326f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1532c7);
    ppvVar4 = std::
              vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
              ::operator[](&local_70.row,local_2b8);
    local_308 = *ppvVar4;
    local_310._M_current =
         (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin
                           (in_stack_fffffffffffffb58);
    while( true ) {
      local_318 = (Node *)std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end
                                    (in_stack_fffffffffffffb58);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60),
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffb58);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_310);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                (in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (uint *)in_stack_fffffffffffffb68,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_328);
      if (!bVar1) {
        testing::Message::Message(&local_330);
        in_stack_fffffffffffffb78 =
             testing::AssertionResult::failure_message((AssertionResult *)0x1533d1);
        testing::internal::AssertHelper::AssertHelper
                  (&local_338,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                   ,0x7a,in_stack_fffffffffffffb78);
        testing::internal::AssertHelper::operator=(&local_338,&local_330);
        testing::internal::AssertHelper::~AssertHelper(&local_338);
        testing::Message::~Message((Message *)0x15342e);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x153483);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_310);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                (in_stack_fffffffffffffb78,
                 (char *)CONCAT17(in_stack_fffffffffffffb77,in_stack_fffffffffffffb70),
                 (uint *)in_stack_fffffffffffffb68,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
      in_stack_fffffffffffffb77 = testing::AssertionResult::operator_cast_to_bool(&local_348);
      if (!(bool)in_stack_fffffffffffffb77) {
        testing::Message::Message(&local_350);
        in_stack_fffffffffffffb68 =
             (float *)testing::AssertionResult::failure_message((AssertionResult *)0x153525);
        testing::internal::AssertHelper::AssertHelper
                  (&local_358,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                   ,0x7b,(char *)in_stack_fffffffffffffb68);
        testing::internal::AssertHelper::operator=(&local_358,&local_350);
        testing::internal::AssertHelper::~AssertHelper(&local_358);
        testing::Message::~Message((Message *)0x153582);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1535d7);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->(&local_310);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((char *)in_stack_ffffffffffffff28.data_,(char *)in_stack_ffffffffffffff20.ptr_,
                 in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
      in_stack_fffffffffffffb67 = testing::AssertionResult::operator_cast_to_bool(&local_368);
      if (!(bool)in_stack_fffffffffffffb67) {
        testing::Message::Message(&local_370);
        in_stack_fffffffffffffb58 =
             (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x153677);
        testing::internal::AssertHelper::AssertHelper
                  (&local_378,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                   ,0x7c,(char *)in_stack_fffffffffffffb58);
        testing::internal::AssertHelper::operator=(&local_378,&local_370);
        testing::internal::AssertHelper::~AssertHelper(&local_378);
        testing::Message::~Message((Message *)0x1536d2);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x153727);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++(&local_310);
    }
  }
  RemoveFile((char *)filename);
  DMatrix::~DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffb67,in_stack_fffffffffffffb60));
  return;
}

Assistant:

TEST(DMATRIX_TEST, Serialize_and_Deserialize) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  // Serialize
#ifndef _MSC_VER
  matrix.Serialize("/tmp/test.bin");
#else
  matrix.Serialize("../../test.bin");
#endif
  matrix.Reset();
  EXPECT_EQ(matrix.has_label, true);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, 0);
  EXPECT_EQ(matrix.pos, 0);
  EXPECT_EQ(matrix.Y.empty(), true);
  EXPECT_EQ(matrix.norm.empty(), true);
  EXPECT_EQ(matrix.row.empty(),true);
  // Deserialize
#ifndef _MSC_VER
  matrix.Deserialize("/tmp/test.bin");
#else
  matrix.Deserialize("../../test.bin");
#endif
  EXPECT_EQ(matrix.row_length, kLength);
  EXPECT_EQ(matrix.hash_value_1, 1234);
  EXPECT_EQ(matrix.hash_value_2, 5678);
  EXPECT_EQ(matrix.has_label, true);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(matrix.Y[i], i);
    EXPECT_EQ(matrix.norm[i], 0.25);
    SparseRow *row = matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, i);
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 2.5);
    }
  }
#ifndef _MSC_VER
  RemoveFile("/tmp/test.bin");
#else
  RemoveFile("../../test.bin");
#endif
}